

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_dft.hpp
# Opt level: O2

bool __thiscall SlidingDFT<double,_64UL>::update(SlidingDFT<double,_64UL> *this,double new_x)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qa;
  double dVar14;
  double local_28;
  double local_20;
  
  dVar3 = this->x[this->x_index];
  this->x[this->x_index] = new_x;
  dVar4 = this->damping_factor;
  dVar13 = pow(dVar4,64.0);
  for (lVar12 = 0x210; lVar12 != 0x610; lVar12 = lVar12 + 0x10) {
    dVar14 = *(double *)(this->twiddle[0x1f]._M_value + lVar12 + 8) * dVar4;
    local_28 = (*(double *)(this->twiddle[0x1f]._M_value + lVar12) * dVar4 - dVar13 * dVar3) + new_x
    ;
    local_20 = dVar14;
    std::operator*((complex<double> *)((long)this->x + lVar12 + -8),(complex<double> *)&local_28);
    *(undefined8 *)(this->twiddle[0x1f]._M_value + lVar12) = extraout_XMM0_Qa;
    *(double *)(this->twiddle[0x1f]._M_value + lVar12 + 8) = dVar14;
  }
  dVar3 = *(double *)this->S[0]._M_value;
  dVar4 = *(double *)(this->S[0]._M_value + 8);
  dVar13 = *(double *)(this->S[1]._M_value + 8);
  dVar14 = *(double *)this->S[0x3f]._M_value;
  dVar6 = *(double *)(this->S[0x3f]._M_value + 8);
  *(double *)this->dft[0]._M_value = (*(double *)this->S[1]._M_value + dVar14) * -0.25 + dVar3 * 0.5
  ;
  *(double *)(this->dft[0]._M_value + 8) = (dVar13 + dVar6) * -0.25 + dVar4 * 0.5;
  dVar13 = dVar3;
  for (lVar12 = 0x618; lVar12 != 0x9f8; lVar12 = lVar12 + 0x10) {
    pdVar1 = (double *)((long)this->x + lVar12);
    dVar7 = *pdVar1;
    dVar8 = pdVar1[1];
    pdVar1 = (double *)((long)this->x + lVar12 + 0x10);
    dVar9 = pdVar1[1];
    dVar5 = *(double *)((long)this->x + lVar12 + -8);
    pdVar2 = (double *)(this->twiddle[0x1f]._M_value + lVar12 + 8);
    *pdVar2 = (dVar13 + *pdVar1) * -0.25 + dVar7 * 0.5;
    pdVar2[1] = (dVar5 + dVar9) * -0.25 + dVar8 * 0.5;
    dVar13 = dVar7;
  }
  dVar13 = *(double *)(this->S[0x3e]._M_value + 8);
  *(double *)this->dft[0x3f]._M_value =
       (*(double *)this->S[0x3e]._M_value + dVar3) * -0.25 + dVar14 * 0.5;
  *(double *)(this->dft[0x3f]._M_value + 8) = (dVar13 + dVar4) * -0.25 + dVar6 * 0.5;
  uVar11 = this->x_index + 1;
  this->x_index = uVar11;
  if (uVar11 < 0x40) {
    bVar10 = this->data_valid;
  }
  else {
    this->data_valid = true;
    this->x_index = 0;
    bVar10 = 1;
  }
  return (bool)(bVar10 & 1);
}

Assistant:

bool update(NumberFormat new_x)
	{
		// Update the storage of the time domain values
		const NumberFormat old_x = this->x[this->x_index];
		this->x[this->x_index] = new_x;

		// Update the DFT
		const NumberFormat r = this->damping_factor;
		const NumberFormat r_to_N = pow(r, (NumberFormat)DFT_Length);
		for (size_t k = 0; k < DFT_Length; k++) {
			this->S[k] = this->twiddle[k] * (r * this->S[k] - r_to_N * old_x + new_x);
		}

		// Apply the Hanning window
		this->dft[0] = (NumberFormat)0.5*this->S[0] - (NumberFormat)0.25*(this->S[DFT_Length - 1] + this->S[1]);
		for (size_t k = 1; k < (DFT_Length - 1); k++) {
			this->dft[k] = (NumberFormat)0.5*this->S[k] - (NumberFormat)0.25*(this->S[k - 1] + this->S[k + 1]);
		}
		this->dft[DFT_Length - 1] = (NumberFormat)0.5*this->S[DFT_Length - 1] - (NumberFormat)0.25*(this->S[DFT_Length - 2] + this->S[0]);

		// Increment the counter
		this->x_index++;
		if (this->x_index >= DFT_Length) {
			this->data_valid = true;
			this->x_index = 0;
		}

		// Done.
		return this->data_valid;
	}